

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

BBox * __thiscall CMU462::DynamicScene::Mesh::get_bbox(BBox *__return_storage_ptr__,Mesh *this)

{
  bool bVar1;
  pointer pVVar2;
  _Self local_28;
  _Self local_20;
  VertexIter it;
  Mesh *this_local;
  BBox *bbox;
  
  it._M_node = (_List_node_base *)this;
  BBox::BBox(__return_storage_ptr__);
  local_20._M_node = (_List_node_base *)HalfedgeMesh::verticesBegin(&this->mesh);
  while( true ) {
    local_28._M_node = (_List_node_base *)HalfedgeMesh::verticesEnd(&this->mesh);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    pVVar2 = std::_List_iterator<CMU462::Vertex>::operator->(&local_20);
    BBox::expand(__return_storage_ptr__,&pVVar2->position);
    std::_List_iterator<CMU462::Vertex>::operator++(&local_20,0);
  }
  return __return_storage_ptr__;
}

Assistant:

BBox Mesh::get_bbox() {
  BBox bbox;
  for (VertexIter it = mesh.verticesBegin(); it != mesh.verticesEnd(); it++) {
    bbox.expand(it->position);
  }
  return bbox;
}